

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhKeyCmp(void *pData,sxu32 nLen,void *pUserData)

{
  int iVar1;
  
  if (*pUserData < *(ulong *)((long)pUserData + 8)) {
    iVar1 = (**(code **)((long)pUserData + 0x10))(*pUserData,pData,(ulong)nLen);
    if (iVar1 == 0) {
      *(ulong *)pUserData = *pUserData + (ulong)nLen;
      iVar1 = 0;
    }
    else {
      iVar1 = -10;
    }
  }
  else {
    iVar1 = -10;
    if (nLen == 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int lhKeyCmp(const void *pData,sxu32 nLen,void *pUserData)
{
	struct lhash_key_cmp *pCmp = (struct lhash_key_cmp *)pUserData;
	int rc;
	if( pCmp->zIn >= pCmp->zEnd ){
		if( nLen > 0 ){
			return UNQLITE_ABORT;
		}
		return UNQLITE_OK;
	}
	/* Perform the comparison */
	rc = pCmp->xCmp((const void *)pCmp->zIn,pData,nLen);
	if( rc != 0 ){
		/* Abort comparison */
		return UNQLITE_ABORT;
	}
	/* Advance the cursor */
	pCmp->zIn += nLen;
	return UNQLITE_OK;
}